

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O1

int get_allocate_points(CHAR_DATA *ch)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  
  lVar2 = 0;
  iVar4 = 0;
  do {
    iVar3 = iVar4 + *(short *)((long)ch->race * 0x88 + 0x49ff90 + lVar2 * 2);
    iVar4 = iVar3 + -0xd;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  iVar1 = strcmp(pc_race_table[ch->race].name,"human");
  iVar3 = iVar3 + -0xb;
  if (iVar1 != 0) {
    iVar3 = iVar4;
  }
  return iVar3;
}

Assistant:

int get_allocate_points(CHAR_DATA *ch)
{
	int allocate = 0, i;

	for (i = STAT_STR; i < MAX_STATS; i++)
	{
		allocate += (pc_race_table[ch->race].max_stats[i] - 13);
	}

	if (!strcmp(pc_race_table[ch->race].name, "human"))
		allocate += 2;

	return allocate;
}